

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O3

void __thiscall level_tools::export_for_maya(level_tools *this,level_mesh *mesh)

{
  pointer pbVar1;
  uint16_t texture;
  xr_object *this_00;
  xr_mesh *pxVar2;
  xr_object *this_01;
  pointer model;
  xr_name_gen name;
  xr_name_gen local_40;
  
  texture = get_terrain_texture(this);
  if (texture != 0xffff) {
    xray_re::msg("separating %s","terrain");
    level_mesh::separate_terrain(mesh,texture);
  }
  xray_re::msg("separating %s","continuous texture-joined meshes");
  mesh->m_restricted_merge = true;
  level_mesh::create_models(mesh);
  xray_re::xr_name_gen::init(&local_40,(EVP_PKEY_CTX *)"lod");
  model = (mesh->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
          super__Vector_impl_data._M_start;
  pbVar1 = (mesh->m_models).super__Vector_base<b_model,_std::allocator<b_model>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (model != pbVar1) {
    this_01 = (xr_object *)0x0;
    do {
      if (model->m_type == MT_MU_MODEL) {
        if ((this->m_rflags & 1) != 0) {
          this_00 = (xr_object *)operator_new(400);
          xray_re::xr_object::xr_object(this_00,&this->super_xr_surface_factory);
          pxVar2 = level_mesh::commit(mesh,this_00,model,0xffffffff);
          std::__cxx11::string::_M_replace
                    ((ulong)&pxVar2->m_name,0,(char *)(pxVar2->m_name)._M_string_length,0x1ea7f6);
          (*(this_00->super_xr_surface_factory)._vptr_xr_surface_factory[6])(this_00);
          this_00->m_flags = 0x14;
          save_object(this,this_00,local_40.m_name);
          xray_re::xr_name_gen::next(&local_40);
          (*(this_00->super_xr_surface_factory)._vptr_xr_surface_factory[1])(this_00);
        }
      }
      else {
        if (model->m_num_instances != 1) {
          __assert_fail("it->num_instances() == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                        ,0x284,"void level_tools::export_for_maya(level_mesh *) const");
        }
        if (this_01 == (xr_object *)0x0) {
          this_01 = (xr_object *)operator_new(400);
          xray_re::xr_object::xr_object(this_01,&this->super_xr_surface_factory);
        }
        level_mesh::commit(mesh,this_01,model,0xffffffff);
      }
      model = model + 1;
    } while (model != pbVar1);
    if (this_01 != (xr_object *)0x0) {
      (*(this_01->super_xr_surface_factory)._vptr_xr_surface_factory[5])(this_01);
      save_object(this,this_01,"cuts");
      (*(this_01->super_xr_surface_factory)._vptr_xr_surface_factory[1])(this_01);
    }
  }
  operator_delete(local_40.m_name,1);
  return;
}

Assistant:

void level_tools::export_for_maya(level_mesh* mesh) const
{
	uint16_t terrain_texture = get_terrain_texture();
	if (terrain_texture != UINT16_MAX) {
		msg("separating %s", "terrain");
		mesh->separate_terrain(terrain_texture);
	}
	msg("separating %s", "continuous texture-joined meshes");
	mesh->enable_restricted_merge();
	mesh->create_models();
	xr_object* maya_object = 0;
	xr_name_gen name("lod", false);
	for (b_model_vec_cit it = mesh->models().begin(), end = mesh->models().end();
			it != end; ++it) {
		if (it->type() != b_model::MT_MU_MODEL) {
			xr_assert(it->num_instances() == 1);
			if (maya_object == 0)
				maya_object = new xr_object(this);
			mesh->commit(*maya_object, *it);
		} else if (m_rflags & RF_WITH_LODS) {
			xr_object* object = new xr_object(this);
			xr_mesh* mesh1 = mesh->commit(*object, *it);
			mesh1->name() = "modelShape";
			object->denominate_surfaces();
			object->flags() = EOF_MULTIPLE_USAGE;
			save_object(object, name.get());
			name.next();
			delete object;
		}
	}
	if (maya_object) {
		maya_object->denominate();
		save_object(maya_object, "cuts");
		delete maya_object;
	}
}